

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O3

double __thiscall
chrono::utils::ChISO2631_Shock_SeatCushionLogger::GetSe(ChISO2631_Shock_SeatCushionLogger *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  ChISO2631_Shock_SeatCushionLogger *pCVar9;
  ChISO2631_Shock_SeatCushionLogger *__new_size;
  size_t i;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  auVar13._0_8_ = this->m_logging_time / this->m_step;
  auVar13._8_8_ = 0;
  auVar13 = vroundsd_avx(auVar13,auVar13,9);
  __new_size = (ChISO2631_Shock_SeatCushionLogger *)vcvttsd2usi_avx512f(auVar13);
  if (__new_size != (ChISO2631_Shock_SeatCushionLogger *)0x0) {
    std::vector<double,_std::allocator<double>_>::resize(&this->m_inp_x,(size_type)__new_size);
    std::vector<double,_std::allocator<double>_>::resize(&this->m_inp_y,(size_type)__new_size);
    this_00 = &this->m_inp_z;
    std::vector<double,_std::allocator<double>_>::resize(this_00,(size_type)__new_size);
    pCVar9 = (ChISO2631_Shock_SeatCushionLogger *)0x0;
    do {
      auVar13 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,pCVar9);
      dVar11 = auVar13._0_8_ * this->m_step;
      dVar10 = ChFunction_Recorder::Get_y(&this->m_raw_inp_x,dVar11);
      (this->m_inp_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[(long)pCVar9] = dVar10;
      dVar10 = ChFunction_Recorder::Get_y(&this->m_raw_inp_y,dVar11);
      (this->m_inp_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[(long)pCVar9] = dVar10;
      dVar11 = ChFunction_Recorder::Get_y(&this->m_raw_inp_z,dVar11);
      (this->m_inp_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[(long)pCVar9] = dVar11;
      pCVar9 = (ChISO2631_Shock_SeatCushionLogger *)((long)&pCVar9->m_step_inp + 1);
    } while (__new_size != pCVar9);
    std::vector<double,_std::allocator<double>_>::resize(&this->m_out_x,(size_type)__new_size);
    std::vector<double,_std::allocator<double>_>::resize(&this->m_out_y,(size_type)__new_size);
    std::vector<double,_std::allocator<double>_>::resize(&this->m_out_z,(size_type)__new_size);
    pdVar5 = (this->m_inp_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->m_inp_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->m_out_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->m_out_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar9 = (ChISO2631_Shock_SeatCushionLogger *)0x0;
    do {
      dVar11 = (this->m_weighting_x).m_u_hist1;
      dVar10 = pdVar5[(long)pCVar9];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar10;
      dVar12 = (this->m_weighting_x).m_y_hist1;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar12;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar11 * 0.00433451;
      auVar13 = vfmadd231sd_fma(auVar18,auVar14,ZEXT816(0x3f93bce0c67ed4f2));
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (this->m_weighting_x).m_u_hist2;
      auVar13 = vfmadd231sd_fma(auVar13,ZEXT816(0xbf912dce6f643bea),auVar1);
      auVar13 = vfmadd231sd_fma(auVar13,auVar16,ZEXT816(0x3fff5057d1782d38));
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (this->m_weighting_x).m_y_hist2;
      auVar13 = vfmadd231sd_fma(auVar13,ZEXT816(0xbfeed8ab92c06184),auVar2);
      (this->m_weighting_x).m_u_hist2 = dVar11;
      (this->m_weighting_x).m_u_hist1 = dVar10;
      (this->m_weighting_x).m_y_hist2 = dVar12;
      (this->m_weighting_x).m_y_hist1 = auVar13._0_8_;
      pdVar7[(long)pCVar9] = auVar13._0_8_;
      dVar11 = (this->m_weighting_y).m_u_hist1;
      dVar10 = pdVar6[(long)pCVar9];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar10;
      dVar12 = (this->m_weighting_y).m_y_hist1;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar12;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar11 * 0.00433451;
      auVar13 = vfmadd231sd_fma(auVar19,auVar15,ZEXT816(0x3f93bce0c67ed4f2));
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (this->m_weighting_y).m_u_hist2;
      auVar13 = vfmadd231sd_fma(auVar13,ZEXT816(0xbf912dce6f643bea),auVar3);
      auVar13 = vfmadd231sd_fma(auVar13,auVar17,ZEXT816(0x3fff5057d1782d38));
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (this->m_weighting_y).m_y_hist2;
      auVar13 = vfmadd231sd_fma(auVar13,ZEXT816(0xbfeed8ab92c06184),auVar4);
      (this->m_weighting_y).m_u_hist2 = dVar11;
      (this->m_weighting_y).m_u_hist1 = dVar10;
      (this->m_weighting_y).m_y_hist2 = dVar12;
      (this->m_weighting_y).m_y_hist1 = auVar13._0_8_;
      pdVar8[(long)pCVar9] = auVar13._0_8_;
      pCVar9 = (ChISO2631_Shock_SeatCushionLogger *)((long)&pCVar9->m_step_inp + 1);
    } while (__new_size != pCVar9);
    ChISO2631_5_Wz::Filter((ChISO2631_5_Wz *)pCVar9,this_00,&this->m_out_z);
    dVar11 = CalcPeaks(pCVar9,&this->m_inp_x,false);
    this->m_dkx = dVar11;
    dVar11 = CalcPeaks(pCVar9,&this->m_inp_y,false);
    this->m_dky = dVar11;
    dVar11 = CalcPeaks(pCVar9,this_00,true);
    this->m_dkz = dVar11;
    dVar11 = pow(this->m_mx * this->m_dkx,6.0);
    dVar10 = pow(this->m_my * this->m_dky,6.0);
    dVar12 = pow(this->m_mz * this->m_dkz,6.0);
    dVar11 = pow(dVar12 + dVar10 + dVar11,0.16666666666666666);
    return dVar11;
  }
  return 0.0;
}

Assistant:

double ChISO2631_Shock_SeatCushionLogger::GetSe() {
    // generate filter input with fs = 160 Hz
    size_t nInDat = static_cast<size_t>(std::floor(m_logging_time / m_step));

    // Return now if no data available (else, CalcPeaks makes out-of-range accesses).
    if (nInDat == 0)
        return 0;

    m_inp_x.resize(nInDat);
    m_inp_y.resize(nInDat);
    m_inp_z.resize(nInDat);

    for (size_t i = 0; i < nInDat; i++) {
        double t = m_step * i;
        m_inp_x[i] = m_raw_inp_x.Get_y(t);
        m_inp_y[i] = m_raw_inp_y.Get_y(t);
        m_inp_z[i] = m_raw_inp_z.Get_y(t);
    }

    m_out_x.resize(nInDat);
    m_out_y.resize(nInDat);
    m_out_z.resize(nInDat);

    for (size_t i = 0; i < nInDat; i++) {
        m_out_x[i] = m_weighting_x.Filter(m_inp_x[i]);
        m_out_y[i] = m_weighting_y.Filter(m_inp_y[i]);
    }

    m_weighting_z.Filter(m_inp_z, m_out_z);

    m_dkx = CalcPeaks(m_inp_x, false);
    m_dky = CalcPeaks(m_inp_y, false);
    m_dkz = CalcPeaks(m_inp_z, true);

    return pow(pow(m_mx * m_dkx, 6.0) + pow(m_my * m_dky, 6.0) + pow(m_mz * m_dkz, 6.0), 1.0 / 6.0);
}